

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O1

void aom_hadamard_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  short *psVar8;
  uint uVar9;
  short *psVar10;
  long lVar11;
  short sVar12;
  undefined4 uVar13;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar17 [16];
  short sVar25;
  undefined4 uVar26;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar30 [16];
  short sVar39;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar54;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar63 [16];
  undefined1 auVar69 [16];
  short sVar82;
  short sVar88;
  undefined4 uVar83;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar101;
  undefined4 uVar96;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar145;
  short sVar146;
  short sVar147;
  short sVar148;
  short sVar149;
  short sVar150;
  short sVar151;
  short sVar152;
  short sVar153;
  short sVar154;
  short sVar155;
  short sVar156;
  int16_t temp_coeff [256];
  short local_240 [56];
  short local_1d0 [8];
  short asStack_1c0 [64];
  short asStack_140 [64];
  short asStack_c0 [92];
  undefined6 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [12];
  undefined6 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar31 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar71 [16];
  undefined1 auVar60 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar61 [16];
  undefined1 auVar67 [16];
  undefined1 auVar73 [16];
  undefined1 auVar62 [16];
  undefined1 auVar68 [16];
  undefined1 auVar74 [16];
  undefined6 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [12];
  undefined1 auVar87 [16];
  undefined6 uVar97;
  undefined8 uVar98;
  undefined1 auVar99 [12];
  undefined1 auVar100 [16];
  
  psVar10 = local_1d0;
  uVar9 = 0;
  lVar11 = 0;
  do {
    psVar1 = src_diff + (ulong)((uint)lVar11 & 8) * src_stride + (ulong)(uVar9 & 8);
    psVar2 = psVar1 + src_stride;
    psVar3 = psVar2 + src_stride;
    psVar4 = psVar3 + src_stride;
    psVar5 = psVar4 + src_stride;
    psVar6 = psVar5 + src_stride;
    psVar7 = psVar6 + src_stride;
    psVar8 = psVar7 + src_stride;
    sVar108 = *psVar2 + *psVar1;
    sVar109 = psVar2[1] + psVar1[1];
    sVar110 = psVar2[2] + psVar1[2];
    sVar111 = psVar2[3] + psVar1[3];
    sVar112 = psVar2[4] + psVar1[4];
    sVar113 = psVar2[5] + psVar1[5];
    sVar114 = psVar2[6] + psVar1[6];
    sVar115 = psVar2[7] + psVar1[7];
    sVar25 = *psVar1 - *psVar2;
    sVar32 = psVar1[1] - psVar2[1];
    sVar33 = psVar1[2] - psVar2[2];
    sVar34 = psVar1[3] - psVar2[3];
    sVar35 = psVar1[4] - psVar2[4];
    sVar36 = psVar1[5] - psVar2[5];
    sVar37 = psVar1[6] - psVar2[6];
    sVar38 = psVar1[7] - psVar2[7];
    sVar136 = *psVar4 + *psVar3;
    sVar138 = psVar4[1] + psVar3[1];
    sVar140 = psVar4[2] + psVar3[2];
    sVar142 = psVar4[3] + psVar3[3];
    sVar144 = psVar4[4] + psVar3[4];
    sVar146 = psVar4[5] + psVar3[5];
    sVar148 = psVar4[6] + psVar3[6];
    sVar150 = psVar4[7] + psVar3[7];
    sVar12 = *psVar3 - *psVar4;
    sVar18 = psVar3[1] - psVar4[1];
    sVar19 = psVar3[2] - psVar4[2];
    sVar20 = psVar3[3] - psVar4[3];
    sVar21 = psVar3[4] - psVar4[4];
    sVar22 = psVar3[5] - psVar4[5];
    sVar23 = psVar3[6] - psVar4[6];
    sVar24 = psVar3[7] - psVar4[7];
    sVar116 = *psVar6 + *psVar5;
    sVar117 = psVar6[1] + psVar5[1];
    sVar118 = psVar6[2] + psVar5[2];
    sVar119 = psVar6[3] + psVar5[3];
    sVar120 = psVar6[4] + psVar5[4];
    sVar121 = psVar6[5] + psVar5[5];
    sVar122 = psVar6[6] + psVar5[6];
    sVar123 = psVar6[7] + psVar5[7];
    sVar95 = *psVar5 - *psVar6;
    sVar101 = psVar5[1] - psVar6[1];
    sVar102 = psVar5[2] - psVar6[2];
    sVar103 = psVar5[3] - psVar6[3];
    sVar104 = psVar5[4] - psVar6[4];
    sVar105 = psVar5[5] - psVar6[5];
    sVar106 = psVar5[6] - psVar6[6];
    sVar107 = psVar5[7] - psVar6[7];
    sVar124 = *psVar8 + *psVar7;
    sVar125 = psVar8[1] + psVar7[1];
    sVar126 = psVar8[2] + psVar7[2];
    sVar127 = psVar8[3] + psVar7[3];
    sVar128 = psVar8[4] + psVar7[4];
    sVar129 = psVar8[5] + psVar7[5];
    sVar130 = psVar8[6] + psVar7[6];
    sVar131 = psVar8[7] + psVar7[7];
    sVar82 = *psVar7 - *psVar8;
    sVar88 = psVar7[1] - psVar8[1];
    sVar89 = psVar7[2] - psVar8[2];
    sVar90 = psVar7[3] - psVar8[3];
    sVar91 = psVar7[4] - psVar8[4];
    sVar92 = psVar7[5] - psVar8[5];
    sVar93 = psVar7[6] - psVar8[6];
    sVar94 = psVar7[7] - psVar8[7];
    sVar39 = sVar136 + sVar108;
    sVar47 = sVar138 + sVar109;
    sVar48 = sVar140 + sVar110;
    sVar49 = sVar142 + sVar111;
    sVar50 = sVar144 + sVar112;
    sVar51 = sVar146 + sVar113;
    sVar52 = sVar148 + sVar114;
    sVar53 = sVar150 + sVar115;
    sVar54 = sVar12 + sVar25;
    sVar75 = sVar18 + sVar32;
    sVar76 = sVar19 + sVar33;
    sVar77 = sVar20 + sVar34;
    sVar78 = sVar21 + sVar35;
    sVar79 = sVar22 + sVar36;
    sVar80 = sVar23 + sVar37;
    sVar81 = sVar24 + sVar38;
    sVar108 = sVar108 - sVar136;
    sVar109 = sVar109 - sVar138;
    sVar110 = sVar110 - sVar140;
    sVar111 = sVar111 - sVar142;
    sVar112 = sVar112 - sVar144;
    sVar113 = sVar113 - sVar146;
    sVar114 = sVar114 - sVar148;
    sVar115 = sVar115 - sVar150;
    sVar25 = sVar25 - sVar12;
    sVar32 = sVar32 - sVar18;
    sVar33 = sVar33 - sVar19;
    sVar34 = sVar34 - sVar20;
    sVar35 = sVar35 - sVar21;
    sVar36 = sVar36 - sVar22;
    sVar37 = sVar37 - sVar23;
    sVar38 = sVar38 - sVar24;
    sVar136 = sVar124 + sVar116;
    sVar138 = sVar125 + sVar117;
    sVar140 = sVar126 + sVar118;
    sVar142 = sVar127 + sVar119;
    sVar144 = sVar128 + sVar120;
    sVar133 = sVar129 + sVar121;
    sVar134 = sVar130 + sVar122;
    sVar135 = sVar131 + sVar123;
    sVar137 = sVar82 + sVar95;
    sVar139 = sVar88 + sVar101;
    sVar141 = sVar89 + sVar102;
    sVar143 = sVar90 + sVar103;
    sVar145 = sVar91 + sVar104;
    sVar147 = sVar92 + sVar105;
    sVar149 = sVar93 + sVar106;
    sVar151 = sVar94 + sVar107;
    sVar116 = sVar116 - sVar124;
    sVar117 = sVar117 - sVar125;
    sVar118 = sVar118 - sVar126;
    sVar119 = sVar119 - sVar127;
    sVar120 = sVar120 - sVar128;
    sVar121 = sVar121 - sVar129;
    sVar122 = sVar122 - sVar130;
    sVar123 = sVar123 - sVar131;
    sVar95 = sVar95 - sVar82;
    sVar101 = sVar101 - sVar88;
    sVar102 = sVar102 - sVar89;
    sVar103 = sVar103 - sVar90;
    sVar104 = sVar104 - sVar91;
    sVar105 = sVar105 - sVar92;
    sVar106 = sVar106 - sVar93;
    sVar107 = sVar107 - sVar94;
    sVar12 = sVar136 + sVar39;
    sVar18 = sVar138 + sVar47;
    sVar20 = sVar140 + sVar48;
    sVar19 = sVar142 + sVar49;
    sVar23 = sVar144 + sVar50;
    sVar21 = sVar133 + sVar51;
    sVar82 = sVar134 + sVar52;
    sVar22 = sVar135 + sVar53;
    sVar90 = sVar137 + sVar54;
    sVar129 = sVar139 + sVar75;
    sVar146 = sVar141 + sVar76;
    sVar130 = sVar143 + sVar77;
    sVar93 = sVar145 + sVar78;
    sVar131 = sVar147 + sVar79;
    sVar150 = sVar149 + sVar80;
    sVar132 = sVar151 + sVar81;
    sVar88 = sVar116 + sVar108;
    sVar152 = sVar117 + sVar109;
    sVar148 = sVar118 + sVar110;
    sVar153 = sVar119 + sVar111;
    sVar91 = sVar120 + sVar112;
    sVar154 = sVar121 + sVar113;
    sVar155 = sVar122 + sVar114;
    sVar156 = sVar123 + sVar115;
    sVar89 = sVar95 + sVar25;
    sVar24 = sVar101 + sVar32;
    sVar124 = sVar102 + sVar33;
    sVar125 = sVar103 + sVar34;
    sVar92 = sVar104 + sVar35;
    sVar126 = sVar105 + sVar36;
    sVar127 = sVar106 + sVar37;
    sVar128 = sVar107 + sVar38;
    sVar39 = sVar39 - sVar136;
    sVar47 = sVar47 - sVar138;
    sVar48 = sVar48 - sVar140;
    sVar49 = sVar49 - sVar142;
    sVar50 = sVar50 - sVar144;
    sVar51 = sVar51 - sVar133;
    sVar52 = sVar52 - sVar134;
    sVar53 = sVar53 - sVar135;
    sVar54 = sVar54 - sVar137;
    sVar75 = sVar75 - sVar139;
    sVar76 = sVar76 - sVar141;
    sVar77 = sVar77 - sVar143;
    sVar78 = sVar78 - sVar145;
    sVar79 = sVar79 - sVar147;
    sVar80 = sVar80 - sVar149;
    sVar81 = sVar81 - sVar151;
    sVar108 = sVar108 - sVar116;
    sVar109 = sVar109 - sVar117;
    sVar110 = sVar110 - sVar118;
    sVar111 = sVar111 - sVar119;
    sVar112 = sVar112 - sVar120;
    sVar113 = sVar113 - sVar121;
    sVar114 = sVar114 - sVar122;
    sVar115 = sVar115 - sVar123;
    sVar25 = sVar25 - sVar95;
    sVar32 = sVar32 - sVar101;
    sVar33 = sVar33 - sVar102;
    sVar34 = sVar34 - sVar103;
    sVar35 = sVar35 - sVar104;
    sVar36 = sVar36 - sVar105;
    sVar37 = sVar37 - sVar106;
    sVar38 = sVar38 - sVar107;
    sVar94 = sVar18 + sVar12;
    sVar95 = sVar109 + sVar108;
    sVar101 = sVar47 + sVar39;
    sVar102 = sVar152 + sVar88;
    sVar103 = sVar24 + sVar89;
    sVar104 = sVar32 + sVar25;
    sVar105 = sVar75 + sVar54;
    sVar106 = sVar129 + sVar90;
    sVar12 = sVar12 - sVar18;
    sVar108 = sVar108 - sVar109;
    sVar39 = sVar39 - sVar47;
    sVar88 = sVar88 - sVar152;
    sVar89 = sVar89 - sVar24;
    sVar25 = sVar25 - sVar32;
    sVar54 = sVar54 - sVar75;
    sVar90 = sVar90 - sVar129;
    sVar116 = sVar19 + sVar20;
    sVar117 = sVar111 + sVar110;
    sVar118 = sVar49 + sVar48;
    sVar119 = sVar153 + sVar148;
    sVar120 = sVar125 + sVar124;
    sVar121 = sVar34 + sVar33;
    sVar122 = sVar77 + sVar76;
    sVar123 = sVar130 + sVar146;
    sVar20 = sVar20 - sVar19;
    sVar110 = sVar110 - sVar111;
    sVar48 = sVar48 - sVar49;
    sVar148 = sVar148 - sVar153;
    sVar124 = sVar124 - sVar125;
    sVar33 = sVar33 - sVar34;
    sVar76 = sVar76 - sVar77;
    sVar146 = sVar146 - sVar130;
    sVar47 = sVar21 + sVar23;
    sVar49 = sVar113 + sVar112;
    sVar75 = sVar51 + sVar50;
    sVar77 = sVar154 + sVar91;
    sVar125 = sVar126 + sVar92;
    sVar107 = sVar36 + sVar35;
    sVar109 = sVar79 + sVar78;
    sVar111 = sVar131 + sVar93;
    sVar23 = sVar23 - sVar21;
    sVar112 = sVar112 - sVar113;
    sVar50 = sVar50 - sVar51;
    sVar91 = sVar91 - sVar154;
    sVar92 = sVar92 - sVar126;
    sVar35 = sVar35 - sVar36;
    sVar78 = sVar78 - sVar79;
    sVar93 = sVar93 - sVar131;
    sVar129 = sVar22 + sVar82;
    sVar130 = sVar115 + sVar114;
    sVar131 = sVar53 + sVar52;
    sVar136 = sVar156 + sVar155;
    sVar138 = sVar128 + sVar127;
    sVar140 = sVar38 + sVar37;
    sVar142 = sVar81 + sVar80;
    sVar144 = sVar132 + sVar150;
    sVar82 = sVar82 - sVar22;
    sVar114 = sVar114 - sVar115;
    sVar52 = sVar52 - sVar53;
    sVar155 = sVar155 - sVar156;
    sVar127 = sVar127 - sVar128;
    sVar37 = sVar37 - sVar38;
    sVar80 = sVar80 - sVar81;
    sVar150 = sVar150 - sVar132;
    sVar38 = sVar116 + sVar94;
    sVar51 = sVar117 + sVar95;
    sVar53 = sVar118 + sVar101;
    sVar79 = sVar119 + sVar102;
    sVar81 = sVar120 + sVar103;
    sVar126 = sVar121 + sVar104;
    sVar128 = sVar122 + sVar105;
    sVar113 = sVar123 + sVar106;
    sVar18 = sVar20 + sVar12;
    sVar19 = sVar110 + sVar108;
    sVar21 = sVar48 + sVar39;
    sVar22 = sVar148 + sVar88;
    sVar24 = sVar124 + sVar89;
    sVar32 = sVar33 + sVar25;
    sVar34 = sVar76 + sVar54;
    sVar36 = sVar146 + sVar90;
    sVar94 = sVar94 - sVar116;
    sVar95 = sVar95 - sVar117;
    sVar101 = sVar101 - sVar118;
    sVar102 = sVar102 - sVar119;
    sVar103 = sVar103 - sVar120;
    sVar104 = sVar104 - sVar121;
    sVar105 = sVar105 - sVar122;
    sVar106 = sVar106 - sVar123;
    sVar12 = sVar12 - sVar20;
    sVar108 = sVar108 - sVar110;
    sVar39 = sVar39 - sVar48;
    sVar88 = sVar88 - sVar148;
    sVar89 = sVar89 - sVar124;
    sVar25 = sVar25 - sVar33;
    sVar54 = sVar54 - sVar76;
    sVar90 = sVar90 - sVar146;
    sVar20 = sVar129 + sVar47;
    sVar33 = sVar130 + sVar49;
    sVar48 = sVar131 + sVar75;
    sVar76 = sVar136 + sVar77;
    sVar124 = sVar138 + sVar125;
    sVar116 = sVar140 + sVar107;
    sVar117 = sVar142 + sVar109;
    sVar110 = sVar144 + sVar111;
    sVar118 = sVar82 + sVar23;
    sVar119 = sVar114 + sVar112;
    sVar120 = sVar52 + sVar50;
    sVar121 = sVar155 + sVar91;
    sVar122 = sVar127 + sVar92;
    sVar115 = sVar37 + sVar35;
    sVar123 = sVar80 + sVar78;
    sVar146 = sVar150 + sVar93;
    sVar47 = sVar47 - sVar129;
    sVar49 = sVar49 - sVar130;
    sVar75 = sVar75 - sVar131;
    sVar77 = sVar77 - sVar136;
    sVar125 = sVar125 - sVar138;
    sVar107 = sVar107 - sVar140;
    sVar109 = sVar109 - sVar142;
    sVar111 = sVar111 - sVar144;
    sVar23 = sVar23 - sVar82;
    sVar112 = sVar112 - sVar114;
    sVar50 = sVar50 - sVar52;
    sVar91 = sVar91 - sVar155;
    sVar92 = sVar92 - sVar127;
    sVar35 = sVar35 - sVar37;
    sVar78 = sVar78 - sVar80;
    sVar93 = sVar93 - sVar150;
    psVar10[-0x38] = sVar20 + sVar38;
    psVar10[-0x37] = sVar33 + sVar51;
    psVar10[-0x36] = sVar48 + sVar53;
    psVar10[-0x35] = sVar76 + sVar79;
    psVar10[-0x34] = sVar124 + sVar81;
    psVar10[-0x33] = sVar116 + sVar126;
    psVar10[-0x32] = sVar117 + sVar128;
    psVar10[-0x31] = sVar110 + sVar113;
    psVar10[-0x30] = sVar94 - sVar47;
    psVar10[-0x2f] = sVar95 - sVar49;
    psVar10[-0x2e] = sVar101 - sVar75;
    psVar10[-0x2d] = sVar102 - sVar77;
    psVar10[-0x2c] = sVar103 - sVar125;
    psVar10[-0x2b] = sVar104 - sVar107;
    psVar10[-0x2a] = sVar105 - sVar109;
    psVar10[-0x29] = sVar106 - sVar111;
    psVar10[-0x28] = sVar38 - sVar20;
    psVar10[-0x27] = sVar51 - sVar33;
    psVar10[-0x26] = sVar53 - sVar48;
    psVar10[-0x25] = sVar79 - sVar76;
    psVar10[-0x24] = sVar81 - sVar124;
    psVar10[-0x23] = sVar126 - sVar116;
    psVar10[-0x22] = sVar128 - sVar117;
    psVar10[-0x21] = sVar113 - sVar110;
    psVar10[-0x20] = sVar47 + sVar94;
    psVar10[-0x1f] = sVar49 + sVar95;
    psVar10[-0x1e] = sVar75 + sVar101;
    psVar10[-0x1d] = sVar77 + sVar102;
    psVar10[-0x1c] = sVar125 + sVar103;
    psVar10[-0x1b] = sVar107 + sVar104;
    psVar10[-0x1a] = sVar109 + sVar105;
    psVar10[-0x19] = sVar111 + sVar106;
    psVar10[-0x18] = sVar23 + sVar12;
    psVar10[-0x17] = sVar112 + sVar108;
    psVar10[-0x16] = sVar50 + sVar39;
    psVar10[-0x15] = sVar91 + sVar88;
    psVar10[-0x14] = sVar92 + sVar89;
    psVar10[-0x13] = sVar35 + sVar25;
    psVar10[-0x12] = sVar78 + sVar54;
    psVar10[-0x11] = sVar93 + sVar90;
    psVar10[-0x10] = sVar12 - sVar23;
    psVar10[-0xf] = sVar108 - sVar112;
    psVar10[-0xe] = sVar39 - sVar50;
    psVar10[-0xd] = sVar88 - sVar91;
    psVar10[-0xc] = sVar89 - sVar92;
    psVar10[-0xb] = sVar25 - sVar35;
    psVar10[-10] = sVar54 - sVar78;
    psVar10[-9] = sVar90 - sVar93;
    psVar10[-8] = sVar18 - sVar118;
    psVar10[-7] = sVar19 - sVar119;
    psVar10[-6] = sVar21 - sVar120;
    psVar10[-5] = sVar22 - sVar121;
    psVar10[-4] = sVar24 - sVar122;
    psVar10[-3] = sVar32 - sVar115;
    psVar10[-2] = sVar34 - sVar123;
    psVar10[-1] = sVar36 - sVar146;
    *psVar10 = sVar118 + sVar18;
    psVar10[1] = sVar119 + sVar19;
    psVar10[2] = sVar120 + sVar21;
    psVar10[3] = sVar121 + sVar22;
    psVar10[4] = sVar122 + sVar24;
    psVar10[5] = sVar115 + sVar32;
    psVar10[6] = sVar123 + sVar34;
    psVar10[7] = sVar146 + sVar36;
    lVar11 = lVar11 + 4;
    psVar10 = psVar10 + 0x40;
    uVar9 = uVar9 + 8;
  } while (lVar11 != 0x10);
  lVar11 = 0;
  do {
    auVar40._0_2_ = asStack_1c0[lVar11] + local_240[lVar11];
    auVar40._2_2_ = asStack_1c0[lVar11 + 1] + local_240[lVar11 + 1];
    auVar40._4_2_ = asStack_1c0[lVar11 + 2] + local_240[lVar11 + 2];
    auVar40._6_2_ = asStack_1c0[lVar11 + 3] + local_240[lVar11 + 3];
    auVar40._8_2_ = asStack_1c0[lVar11 + 4] + local_240[lVar11 + 4];
    auVar40._10_2_ = asStack_1c0[lVar11 + 5] + local_240[lVar11 + 5];
    auVar40._12_2_ = asStack_1c0[lVar11 + 6] + local_240[lVar11 + 6];
    auVar40._14_2_ = asStack_1c0[lVar11 + 7] + local_240[lVar11 + 7];
    auVar17._0_2_ = local_240[lVar11] - asStack_1c0[lVar11];
    auVar17._2_2_ = local_240[lVar11 + 1] - asStack_1c0[lVar11 + 1];
    auVar17._4_2_ = local_240[lVar11 + 2] - asStack_1c0[lVar11 + 2];
    auVar17._6_2_ = local_240[lVar11 + 3] - asStack_1c0[lVar11 + 3];
    auVar17._8_2_ = local_240[lVar11 + 4] - asStack_1c0[lVar11 + 4];
    auVar17._10_2_ = local_240[lVar11 + 5] - asStack_1c0[lVar11 + 5];
    auVar17._12_2_ = local_240[lVar11 + 6] - asStack_1c0[lVar11 + 6];
    auVar17._14_2_ = local_240[lVar11 + 7] - asStack_1c0[lVar11 + 7];
    auVar56._0_2_ = asStack_c0[lVar11] + asStack_140[lVar11];
    auVar56._2_2_ = asStack_c0[lVar11 + 1] + asStack_140[lVar11 + 1];
    auVar56._4_2_ = asStack_c0[lVar11 + 2] + asStack_140[lVar11 + 2];
    auVar56._6_2_ = asStack_c0[lVar11 + 3] + asStack_140[lVar11 + 3];
    auVar56._8_2_ = asStack_c0[lVar11 + 4] + asStack_140[lVar11 + 4];
    auVar56._10_2_ = asStack_c0[lVar11 + 5] + asStack_140[lVar11 + 5];
    auVar56._12_2_ = asStack_c0[lVar11 + 6] + asStack_140[lVar11 + 6];
    auVar56._14_2_ = asStack_c0[lVar11 + 7] + asStack_140[lVar11 + 7];
    auVar55._0_2_ = asStack_140[lVar11] - asStack_c0[lVar11];
    auVar55._2_2_ = asStack_140[lVar11 + 1] - asStack_c0[lVar11 + 1];
    auVar55._4_2_ = asStack_140[lVar11 + 2] - asStack_c0[lVar11 + 2];
    auVar55._6_2_ = asStack_140[lVar11 + 3] - asStack_c0[lVar11 + 3];
    auVar55._8_2_ = asStack_140[lVar11 + 4] - asStack_c0[lVar11 + 4];
    auVar55._10_2_ = asStack_140[lVar11 + 5] - asStack_c0[lVar11 + 5];
    auVar55._12_2_ = asStack_140[lVar11 + 6] - asStack_c0[lVar11 + 6];
    auVar55._14_2_ = asStack_140[lVar11 + 7] - asStack_c0[lVar11 + 7];
    auVar30 = psraw(auVar40,1);
    auVar17 = psraw(auVar17,1);
    auVar40 = psraw(auVar56,1);
    auVar56 = psraw(auVar55,1);
    sVar34 = auVar40._0_2_ + auVar30._0_2_;
    sVar36 = auVar40._2_2_ + auVar30._2_2_;
    uVar83 = CONCAT22(sVar36,sVar34);
    sVar25 = auVar40._4_2_ + auVar30._4_2_;
    uVar84 = CONCAT24(sVar25,uVar83);
    sVar108 = auVar40._6_2_ + auVar30._6_2_;
    uVar85 = CONCAT26(sVar108,uVar84);
    sVar33 = auVar40._8_2_ + auVar30._8_2_;
    auVar86._0_10_ = CONCAT28(sVar33,uVar85);
    auVar86._10_2_ = auVar40._10_2_ + auVar30._10_2_;
    auVar87._12_2_ = auVar40._12_2_ + auVar30._12_2_;
    auVar87._0_12_ = auVar86;
    auVar87._14_2_ = auVar40._14_2_ + auVar30._14_2_;
    sVar39 = auVar56._0_2_ + auVar17._0_2_;
    sVar88 = auVar56._2_2_ + auVar17._2_2_;
    uVar96 = CONCAT22(sVar88,sVar39);
    sVar35 = auVar56._4_2_ + auVar17._4_2_;
    uVar97 = CONCAT24(sVar35,uVar96);
    sVar89 = auVar56._6_2_ + auVar17._6_2_;
    uVar98 = CONCAT26(sVar89,uVar97);
    sVar37 = auVar56._8_2_ + auVar17._8_2_;
    auVar99._0_10_ = CONCAT28(sVar37,uVar98);
    auVar99._10_2_ = auVar56._10_2_ + auVar17._10_2_;
    auVar100._12_2_ = auVar56._12_2_ + auVar17._12_2_;
    auVar100._0_12_ = auVar99;
    auVar100._14_2_ = auVar56._14_2_ + auVar17._14_2_;
    sVar22 = auVar30._0_2_ - auVar40._0_2_;
    sVar23 = auVar30._2_2_ - auVar40._2_2_;
    uVar26 = CONCAT22(sVar23,sVar22);
    sVar24 = auVar30._4_2_ - auVar40._4_2_;
    uVar27 = CONCAT24(sVar24,uVar26);
    sVar32 = auVar30._6_2_ - auVar40._6_2_;
    uVar28 = CONCAT26(sVar32,uVar27);
    sVar82 = auVar30._8_2_ - auVar40._8_2_;
    auVar29._0_10_ = CONCAT28(sVar82,uVar28);
    auVar29._10_2_ = auVar30._10_2_ - auVar40._10_2_;
    auVar31._12_2_ = auVar30._12_2_ - auVar40._12_2_;
    auVar31._0_12_ = auVar29;
    auVar31._14_2_ = auVar30._14_2_ - auVar40._14_2_;
    sVar12 = auVar17._0_2_ - auVar56._0_2_;
    sVar18 = auVar17._2_2_ - auVar56._2_2_;
    uVar13 = CONCAT22(sVar18,sVar12);
    sVar19 = auVar17._4_2_ - auVar56._4_2_;
    uVar14 = CONCAT24(sVar19,uVar13);
    sVar20 = auVar17._6_2_ - auVar56._6_2_;
    uVar15 = CONCAT26(sVar20,uVar14);
    sVar21 = auVar17._8_2_ - auVar56._8_2_;
    auVar16._0_10_ = CONCAT28(sVar21,uVar15);
    auVar16._10_2_ = auVar17._10_2_ - auVar56._10_2_;
    auVar30._12_2_ = auVar17._12_2_ - auVar56._12_2_;
    auVar30._0_12_ = auVar16;
    auVar30._14_2_ = auVar17._14_2_ - auVar56._14_2_;
    auVar17 = psraw(auVar87,0xf);
    auVar62._12_2_ = sVar108;
    auVar62._0_12_ = auVar86;
    auVar62._14_2_ = auVar17._6_2_;
    auVar61._12_4_ = auVar62._12_4_;
    auVar61._10_2_ = auVar17._4_2_;
    auVar61._0_10_ = auVar86._0_10_;
    auVar60._10_6_ = auVar61._10_6_;
    auVar60._8_2_ = sVar25;
    auVar60._0_8_ = uVar85;
    auVar59._8_8_ = auVar60._8_8_;
    auVar59._6_2_ = auVar17._2_2_;
    auVar59._0_6_ = uVar84;
    auVar58._6_10_ = auVar59._6_10_;
    auVar58._4_2_ = sVar36;
    auVar58._0_4_ = uVar83;
    auVar57._4_12_ = auVar58._4_12_;
    auVar57._2_2_ = auVar17._0_2_;
    auVar57._0_2_ = sVar34;
    *(undefined1 (*) [16])coeff = auVar57;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x20) = sVar33;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 2) = auVar17._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 4) = auVar86._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 6) = auVar17._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 8) = auVar87._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 10) = auVar17._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xc) = auVar87._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xe) = auVar17._14_2_;
    auVar17 = psraw(auVar100,0xf);
    auVar68._12_2_ = sVar89;
    auVar68._0_12_ = auVar99;
    auVar68._14_2_ = auVar17._6_2_;
    auVar67._12_4_ = auVar68._12_4_;
    auVar67._10_2_ = auVar17._4_2_;
    auVar67._0_10_ = auVar99._0_10_;
    auVar66._10_6_ = auVar67._10_6_;
    auVar66._8_2_ = sVar35;
    auVar66._0_8_ = uVar98;
    auVar65._8_8_ = auVar66._8_8_;
    auVar65._6_2_ = auVar17._2_2_;
    auVar65._0_6_ = uVar97;
    auVar64._6_10_ = auVar65._6_10_;
    auVar64._4_2_ = sVar88;
    auVar64._0_4_ = uVar96;
    auVar63._4_12_ = auVar64._4_12_;
    auVar63._2_2_ = auVar17._0_2_;
    auVar63._0_2_ = sVar39;
    *(undefined1 (*) [16])((long)coeff + 0x100) = auVar63;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x120) = sVar37;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 2) = auVar17._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 4) = auVar99._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 6) = auVar17._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 8) = auVar100._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 10) = auVar17._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 0xc) = auVar100._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 0xe) = auVar17._14_2_;
    auVar17 = psraw(auVar31,0xf);
    auVar74._12_2_ = sVar32;
    auVar74._0_12_ = auVar29;
    auVar74._14_2_ = auVar17._6_2_;
    auVar73._12_4_ = auVar74._12_4_;
    auVar73._10_2_ = auVar17._4_2_;
    auVar73._0_10_ = auVar29._0_10_;
    auVar72._10_6_ = auVar73._10_6_;
    auVar72._8_2_ = sVar24;
    auVar72._0_8_ = uVar28;
    auVar71._8_8_ = auVar72._8_8_;
    auVar71._6_2_ = auVar17._2_2_;
    auVar71._0_6_ = uVar27;
    auVar70._6_10_ = auVar71._6_10_;
    auVar70._4_2_ = sVar23;
    auVar70._0_4_ = uVar26;
    auVar69._4_12_ = auVar70._4_12_;
    auVar69._2_2_ = auVar17._0_2_;
    auVar69._0_2_ = sVar22;
    *(undefined1 (*) [16])((long)coeff + 0x200) = auVar69;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x220) = sVar82;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 2) = auVar17._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 4) = auVar29._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 6) = auVar17._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 8) = auVar31._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 10) = auVar17._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 0xc) = auVar31._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 0xe) = auVar17._14_2_;
    auVar17 = psraw(auVar30,0xf);
    auVar46._12_2_ = sVar20;
    auVar46._0_12_ = auVar16;
    auVar46._14_2_ = auVar17._6_2_;
    auVar45._12_4_ = auVar46._12_4_;
    auVar45._10_2_ = auVar17._4_2_;
    auVar45._0_10_ = auVar16._0_10_;
    auVar44._10_6_ = auVar45._10_6_;
    auVar44._8_2_ = sVar19;
    auVar44._0_8_ = uVar15;
    auVar43._8_8_ = auVar44._8_8_;
    auVar43._6_2_ = auVar17._2_2_;
    auVar43._0_6_ = uVar14;
    auVar42._6_10_ = auVar43._6_10_;
    auVar42._4_2_ = sVar18;
    auVar42._0_4_ = uVar13;
    auVar41._4_12_ = auVar42._4_12_;
    auVar41._2_2_ = auVar17._0_2_;
    auVar41._0_2_ = sVar12;
    *(undefined1 (*) [16])((long)coeff + 0x300) = auVar41;
    *(short *)*(undefined1 (*) [16])((long)coeff + 800) = sVar21;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 2) = auVar17._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 4) = auVar16._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 6) = auVar17._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 8) = auVar30._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 10) = auVar17._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 0xc) = auVar30._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 0xe) = auVar17._14_2_;
    uVar9 = (uint)lVar11;
    coeff = (tran_low_t *)
            ((long)*(undefined1 (*) [16])((long)coeff + 0x10) + (ulong)(uVar9 & 8) * 4);
    lVar11 = lVar11 + 8;
  } while (uVar9 < 0x38);
  return;
}

Assistant:

void aom_hadamard_16x16_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  hadamard_16x16_sse2(src_diff, src_stride, coeff, 1);
}